

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O3

void __thiscall
ComparisonFailure::ComparisonFailure
          (ComparisonFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          SimpleString *checkString,SimpleString *comparisonString,SimpleString *text)

{
  SimpleString *this_00;
  
  TestFailure::TestFailure(&this->super_TestFailure,test,fileName,lineNumber);
  (this->super_TestFailure)._vptr_TestFailure = (_func_int **)&PTR__TestFailure_0012d890;
  TestFailure::createUserText((TestFailure *)&stack0xffffffffffffffd0,(SimpleString *)test);
  this_00 = &(this->super_TestFailure).message_;
  SimpleString::operator=(this_00,(SimpleString *)&stack0xffffffffffffffd0);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffd0);
  SimpleString::operator+=(this_00,checkString);
  SimpleString::operator+=(this_00,"(");
  SimpleString::operator+=(this_00,comparisonString);
  SimpleString::operator+=(this_00,") failed");
  return;
}

Assistant:

ComparisonFailure::ComparisonFailure(UtestShell *test, const char *fileName, size_t lineNumber, const SimpleString& checkString, const SimpleString &comparisonString, const SimpleString &text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);
    message_ += checkString;
    message_ += "(";
    message_ += comparisonString;
    message_ += ") failed";
}